

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.hpp
# Opt level: O2

bool units::is_valid(precise_measurement *meas)

{
  double dVar1;
  undefined4 uVar2;
  
  dVar1 = (meas->units_).multiplier_;
  uVar2 = (meas->units_).base_units_;
  if ((uVar2 != -0x56b5b78 || !NAN(dVar1)) && (uVar2 != -0x56b5b78 && !NAN(dVar1))) {
    return !NAN(meas->value_);
  }
  return false;
}

Assistant:

constexpr precise_unit units() const { return units_; }